

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O0

void IOcontroller::write_result(string *outFileName,TResult *resultObj,string *outFolder)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *outFolder_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  ostream local_260 [8];
  ofstream outFileNew;
  double Boundmin_cost_influence;
  double Boundmin_influence;
  size_t RRsetsSize;
  int seedSize;
  double influenceOriginal;
  double influence;
  double runTime;
  double approx;
  string *outFolder_local;
  TResult *resultObj_local;
  string *outFileName_local;
  
  dVar5 = ResultInfo::get_approximation(resultObj);
  dVar6 = ResultInfo::get_running_time(resultObj);
  dVar7 = ResultInfo::get_influence(resultObj);
  dVar8 = ResultInfo::get_influence_original(resultObj);
  iVar2 = ResultInfo::get_seed_size(resultObj);
  sVar3 = ResultInfo::get_RRsets_size(resultObj);
  dVar9 = ResultInfo::get_boundmin_inf(resultObj);
  dVar10 = ResultInfo::get_boundmin_inf_cost(resultObj);
  poVar4 = std::operator<<((ostream *)&std::cout,"   --------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |Approx.: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |Time (sec): ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |Influence: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar7);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |Self-estimated influence: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |#Seeds: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |#RR sets: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |BoundMin Influence: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar9);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  |BoundMinCost Influence: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar10);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"   --------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  outFolder_00 = (char *)std::__cxx11::string::c_str();
  mkdir_absence(outFolder_00);
  std::operator+(&local_2a0,outFolder,"/");
  std::operator+(&local_280,&local_2a0,outFileName);
  std::ofstream::ofstream(local_260,(string *)&local_280,_S_out);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<(local_260,"Approx.: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_260,"Time (sec): ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_260,"Influence: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar7);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_260,"Self-estimated influence: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_260,"#Seeds: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_260,"#RR sets: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_260,"BoundMin Influence: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar9);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(local_260,"BoundMinCost Influence: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar10);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_260);
  return;
}

Assistant:

static void write_result(const std::string& outFileName, const TResult& resultObj, const std::string& outFolder)
    {
        const auto approx = resultObj.get_approximation();
        const auto runTime = resultObj.get_running_time();
        const auto influence = resultObj.get_influence();
        const auto influenceOriginal = resultObj.get_influence_original();
        const auto seedSize = resultObj.get_seed_size();
        const auto RRsetsSize = resultObj.get_RRsets_size();
        const auto Boundmin_influence = resultObj.get_boundmin_inf();
        const auto Boundmin_cost_influence = resultObj.get_boundmin_inf_cost();

        std::cout << "   --------------------" << std::endl;
        std::cout << "  |Approx.: " << approx << std::endl;
        std::cout << "  |Time (sec): " << runTime << std::endl;
        std::cout << "  |Influence: " << influence << std::endl;
        std::cout << "  |Self-estimated influence: " << influenceOriginal << std::endl;
        std::cout << "  |#Seeds: " << seedSize << std::endl;
        std::cout << "  |#RR sets: " << RRsetsSize << std::endl;
        std::cout << "  |BoundMin Influence: " << Boundmin_influence << std::endl;
        std::cout << "  |BoundMinCost Influence: " << Boundmin_cost_influence << std::endl;
        std::cout << "   --------------------" << std::endl;
        mkdir_absence(outFolder.c_str());
        std::ofstream outFileNew(outFolder + "/" + outFileName);
        if (outFileNew.is_open())
        {
            outFileNew << "Approx.: " << approx << std::endl;
            outFileNew << "Time (sec): " << runTime << std::endl;
            outFileNew << "Influence: " << influence << std::endl;
            outFileNew << "Self-estimated influence: " << influenceOriginal << std::endl;
            outFileNew << "#Seeds: " << seedSize << std::endl;
            outFileNew << "#RR sets: " << RRsetsSize << std::endl;
            outFileNew << "BoundMin Influence: " << Boundmin_influence << std::endl;
            outFileNew << "BoundMinCost Influence: " << Boundmin_cost_influence << std::endl;
            outFileNew.close();
        }
    }